

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighborhoods.cpp
# Opt level: O2

NeighborIndices __thiscall lume::Neighborhoods::neighbor_indices(Neighborhoods *this,GrobIndex gi)

{
  LumeError *this_00;
  string *what;
  NeighborIndices NVar1;
  allocator local_39;
  string local_38 [32];
  
  if (this->m_grobBaseInds[(ulong)gi & 0xffffffff] <
      (uint)((ulong)((long)(this->m_offsets).m_vector.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->m_offsets).m_vector.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2)) {
    NVar1.m_neighborhoods = this;
    NVar1.m_grobIndex = gi;
    return NVar1;
  }
  this_00 = (LumeError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_38,"This Neighborhoods instance doesn\'t provide neighbors for grobs of type ",
             &local_39);
  GrobName_abi_cxx11_(gi.grobType);
  what = (string *)std::__cxx11::string::append(local_38);
  LumeError::LumeError(this_00,what);
  __cxa_throw(this_00,&LumeError::typeinfo,LumeError::~LumeError);
}

Assistant:

NeighborIndices Neighborhoods::
neighbor_indices (const GrobIndex gi) const
{
	const index_t baseIndex = base_index (gi);

	if (baseIndex >= m_offsets.size())
		throw LumeError (std::string("This Neighborhoods instance doesn't provide "
		                             "neighbors for grobs of type ")
						.append (GrobName (gi.grobType)));

	return NeighborIndices (gi, this);
}